

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

LY_ERR lys_parse_in(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,
                   _func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *custom_check
                   ,void *check_data,ly_set *new_mods,lys_module **module)

{
  lysp_ext_instance **pplVar1;
  uint16_t *puVar2;
  long *plVar3;
  lysp_yang_ctx *pctx;
  lysp_revision *value;
  lysp_module *plVar4;
  lysp_tpdf *plVar5;
  lysp_import *plVar6;
  lyd_node *plVar7;
  bool bVar8;
  byte bVar9;
  ly_bool lVar10;
  LY_ERR LVar11;
  int iVar12;
  uint uVar13;
  lys_module *mod;
  ly_err_item *plVar14;
  lys_module *plVar15;
  long *plVar16;
  char **ppcVar17;
  ulong uVar18;
  lysp_ext_instance *plVar19;
  lyplg_ext_record *plVar20;
  char **ppcVar21;
  size_t sVar22;
  char *pcVar23;
  void *pvVar24;
  lysp_ext_instance *plVar25;
  long lVar26;
  lyd_node *plVar27;
  ly_ctx *plVar28;
  lysp_ext_instance *plVar29;
  char *pcVar30;
  lysp_ext_instance *plVar31;
  undefined8 *puVar32;
  lysp_yang_ctx **context;
  int iVar33;
  ulong uVar34;
  long lVar35;
  byte bVar36;
  void *local_c0;
  lys_module *local_a0;
  char *local_98;
  ulong local_90;
  lysp_yin_ctx *yinctx;
  lysp_yang_ctx *yangctx;
  lysf_ctx local_78;
  lys_module *local_58;
  lysf_ctx local_50;
  
  bVar36 = 0;
  yangctx = (lysp_yang_ctx *)0x0;
  yinctx = (lysp_yin_ctx *)0x0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ctx = ctx;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (new_mods == (ly_set *)0x0)) {
    __assert_fail("ctx && in && new_mods",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x721,
                  "LY_ERR lys_parse_in(struct ly_ctx *, struct ly_in *, LYS_INFORMAT, LY_ERR (*)(const struct ly_ctx *, struct lysp_module *, struct lysp_submodule *, void *), void *, struct ly_set *, struct lys_module **)"
                 );
  }
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  mod = (lys_module *)calloc(1,0x80);
  if (mod == (lys_module *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_parse_in");
    return LY_EMEM;
  }
  mod->ctx = ctx;
  if (format == LYS_IN_YANG) {
    context = &yangctx;
    LVar11 = yang_parse_module(context,in,mod);
LAB_0015549b:
    bVar8 = true;
    if (LVar11 != LY_SUCCESS) {
      local_a0 = (lys_module *)0x0;
LAB_001554bc:
      if ((LVar11 & ~LY_EEXIST) != LY_SUCCESS) goto LAB_001554f3;
      goto LAB_001555db;
    }
    pctx = *context;
    lysp_sort_revisions(mod->parsed->revs);
    value = mod->parsed->revs;
    if (value != (lysp_revision *)0x0) {
      local_a0 = (lys_module *)0x0;
      LVar11 = lydict_insert(ctx,value->date,0,&mod->revision);
      if (LVar11 != LY_SUCCESS) goto LAB_001554bc;
    }
    plVar15 = ly_ctx_get_module_latest(ctx,mod->name);
    if (plVar15 == (lys_module *)0x0) {
      bVar9 = 1;
      plVar15 = (lys_module *)0x0;
LAB_00155649:
      mod->latest_revision = bVar9;
    }
    else {
      if ((mod->revision != (char *)0x0) &&
         ((plVar15->revision == (char *)0x0 ||
          (iVar12 = strcmp(mod->revision,plVar15->revision), 0 < iVar12)))) {
        bVar9 = plVar15->latest_revision & 3;
        goto LAB_00155649;
      }
      plVar15 = (lys_module *)0x0;
    }
    if (custom_check != (_func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *)0x0)
    {
      local_a0 = (lys_module *)0x0;
      LVar11 = (*custom_check)(ctx,mod->parsed,(lysp_submodule *)0x0,check_data);
      if (LVar11 != LY_SUCCESS) {
        bVar8 = true;
        goto LAB_001554bc;
      }
    }
    local_a0 = ly_ctx_get_module(ctx,mod->name,mod->revision);
    if (local_a0 == (lys_module *)0x0) {
      local_a0 = ly_ctx_get_module_latest_ns(ctx,mod->ns);
      if ((local_a0 == (lys_module *)0x0) || (local_a0->revision != mod->revision)) {
        if (in->type != LY_IN_ERROR) {
          if (in->type == LY_IN_FILEPATH) {
            ly_check_module_filename
                      (ctx,mod->name,mod->parsed->revs->date,(in->method).fpath.filepath);
          }
          lys_parser_fill_filepath(ctx,in,&mod->filepath);
          if (plVar15 != (lys_module *)0x0) {
            plVar15->latest_revision = plVar15->latest_revision & 0xfc;
          }
          pcVar23 = mod->name;
          iVar12 = strcmp(pcVar23,"ietf-netconf");
          if (iVar12 != 0) {
            iVar12 = strcmp(pcVar23,"ietf-netconf-with-defaults");
            if (iVar12 == 0) {
              plVar4 = mod->parsed;
              plVar25 = plVar4->exts;
              if (plVar25 == (lysp_ext_instance *)0x0) {
                plVar16 = (long *)malloc(0x78);
                if (plVar16 != (long *)0x0) {
                  *plVar16 = 1;
                  lVar26 = 1;
                  goto LAB_00155d89;
                }
              }
              else {
                plVar29 = plVar25[-1].exts;
                plVar25[-1].exts = (lysp_ext_instance *)((long)&plVar29->name + 1);
                plVar16 = (long *)realloc(&plVar25[-1].exts,(long)plVar29 * 0x70 + 0x78);
                if (plVar16 != (long *)0x0) {
                  lVar26 = *plVar16;
LAB_00155d89:
                  plVar4->exts = (lysp_ext_instance *)(plVar16 + 1);
                  plVar3 = plVar16 + lVar26 * 0xe;
                  plVar3[-1] = 0;
                  *plVar3 = 0;
                  plVar3[-3] = 0;
                  plVar3[-2] = 0;
                  plVar3[-5] = 0;
                  plVar3[-4] = 0;
                  plVar3[-7] = 0;
                  plVar3[-6] = 0;
                  plVar3[-9] = 0;
                  plVar3[-8] = 0;
                  plVar3[-0xb] = 0;
                  plVar3[-10] = 0;
                  plVar3[-0xd] = 0;
                  plVar3[-0xc] = 0;
                  LVar11 = lydict_insert(plVar4->mod->ctx,"md_:annotation",0,
                                         (char **)(plVar3 + -0xd));
                  if ((LVar11 == LY_SUCCESS) &&
                     (LVar11 = lydict_insert(plVar4->mod->ctx,"default",0,
                                             (char **)(plVar16 + lVar26 * 0xe + -0xc)),
                     LVar11 == LY_SUCCESS)) {
                    *(undefined4 *)(plVar16 + lVar26 * 0xe + -0xb) = 1;
                    plVar16[lVar26 * 0xe + -10] = (long)plVar4;
                    plVar16[lVar26 * 0xe + -8] = (long)plVar4;
                    *(undefined4 *)(plVar16 + lVar26 * 0xe + -7) = 0x1c0000;
                    *(undefined2 *)(plVar16 + lVar26 * 0xe + -5) = 0x1000;
                    lVar35 = 1;
                    ppcVar21 = (char **)calloc(1,0x38);
                    plVar16[lVar26 * 0xe + -1] = (long)ppcVar21;
                    plVar28 = plVar4->mod->ctx;
                    if (ppcVar21 == (char **)0x0) {
LAB_00156868:
                      LVar11 = LY_EMEM;
                      ly_log(plVar28,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lysp_add_internal_ietf_netconf_with_defaults");
                    }
                    else {
                      LVar11 = lydict_insert(plVar28,"type",0,ppcVar21);
                      if ((LVar11 == LY_SUCCESS) &&
                         (LVar11 = lydict_insert(plVar4->mod->ctx,"boolean",0,ppcVar21 + 1),
                         LVar11 == LY_SUCCESS)) {
                        *(undefined4 *)(ppcVar21 + 2) = 1;
                        ppcVar21[3] = (char *)plVar4;
                        *(undefined4 *)((long)ppcVar21 + 0x34) = 0x2e0000;
                        if (plVar25 == (lysp_ext_instance *)0x0) {
                          if ((lysp_yang_ctx *)pctx->main_ctx != pctx) {
                            __assert_fail("pctx->main_ctx == pctx",
                                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                                          ,0x6c4,
                                          "LY_ERR lysp_add_internal_ietf_netconf_with_defaults(struct lysp_ctx *, struct lysp_module *)"
                                         );
                          }
                          LVar11 = ly_set_add(&pctx->ext_inst,plVar4->exts,'\x01',(uint32_t *)0x0);
                          if (LVar11 == LY_SUCCESS) goto LAB_00156408;
                        }
                        else {
                          lVar10 = ly_set_contains(&pctx->ext_inst,plVar25,(uint32_t *)&local_78);
                          if (lVar10 == '\0') {
                            LVar11 = LY_EINT;
                            ly_log(plVar4->mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                                   ,0x6c9);
                          }
                          else {
                            (pctx->ext_inst).field_2.dnodes[(ulong)local_78.ctx & 0xffffffff] =
                                 (lyd_node *)plVar4->exts;
LAB_00156408:
                            plVar6 = plVar4->imports;
                            if (plVar6 == (lysp_import *)0x0) {
                              plVar16 = (long *)malloc(0x48);
                              if (plVar16 == (long *)0x0) goto LAB_00156861;
                              *plVar16 = 1;
                            }
                            else {
                              lVar26 = *(long *)(plVar6[-1].rev + 6) + 1;
                              *(long *)(plVar6[-1].rev + 6) = lVar26;
                              plVar16 = (long *)realloc(plVar6[-1].rev + 6,lVar26 * 0x40 | 8);
                              if (plVar16 == (long *)0x0) {
                                pcVar23 = plVar4->imports[-1].rev + 6;
                                *(long *)pcVar23 = *(long *)pcVar23 + -1;
LAB_00156861:
                                plVar28 = plVar4->mod->ctx;
                                goto LAB_00156868;
                              }
                              lVar35 = *plVar16;
                            }
                            plVar4->imports = (lysp_import *)(plVar16 + 1);
                            plVar3 = plVar16 + lVar35 * 8;
                            plVar3[-1] = 0;
                            *plVar3 = 0;
                            plVar3[-3] = 0;
                            plVar3[-2] = 0;
                            plVar3[-5] = 0;
                            plVar3[-4] = 0;
                            plVar3[-7] = 0;
                            plVar3[-6] = 0;
                            LVar11 = lydict_insert(plVar4->mod->ctx,"ietf-yang-metadata",0,
                                                   (char **)(plVar3 + -6));
                            if ((LVar11 == LY_SUCCESS) &&
                               (LVar11 = lydict_insert(plVar4->mod->ctx,"md_",0,
                                                       (char **)(plVar16 + lVar35 * 8 + -5)),
                               LVar11 == LY_SUCCESS)) {
                              *(undefined2 *)(plVar16 + lVar35 * 8 + -1) = 0x1000;
                              goto LAB_00155791;
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_001562e8;
                }
                pplVar1 = &plVar4->exts[-1].exts;
                *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
              }
              LVar11 = LY_EMEM;
              ly_log(plVar4->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lysp_add_internal_ietf_netconf_with_defaults");
              goto LAB_001562e8;
            }
            iVar12 = strcmp(pcVar23,"yang");
            if (iVar12 != 0) goto LAB_00155791;
            plVar4 = mod->parsed;
            plVar25 = plVar4->exts;
            plVar5 = plVar4->typedefs;
            if (plVar5 == (lysp_tpdf *)0x0) {
              plVar16 = (long *)malloc(0xb8);
              if (plVar16 == (long *)0x0) goto LAB_00155f0a;
              *plVar16 = 1;
              lVar26 = 1;
            }
            else {
              lVar26 = *(long *)&plVar5[-1].flags;
              *(long *)&plVar5[-1].flags = lVar26 + 1;
              plVar16 = (long *)realloc(&plVar5[-1].flags,lVar26 * 0xb0 + 0xb8);
              if (plVar16 == (long *)0x0) {
                puVar2 = &plVar4->typedefs[-1].flags;
                *(long *)puVar2 = *(long *)puVar2 + -1;
LAB_00155f0a:
                if (pctx == (lysp_yang_ctx *)0x0) {
                  plVar28 = (ly_ctx *)0x0;
                }
                else {
                  plVar28 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                LVar11 = LY_EMEM;
                ly_log(plVar28,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lysp_add_internal_yang");
                goto LAB_001562e8;
              }
              lVar26 = *plVar16;
            }
            plVar4->typedefs = (lysp_tpdf *)(plVar16 + 1);
            plVar28 = (ly_ctx *)0x0;
            memset(plVar16 + lVar26 * 0x16 + -0x15,0,0xb0);
            if (pctx != (lysp_yang_ctx *)0x0) {
              plVar28 = (ly_ctx *)
                        **(undefined8 **)
                          (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            }
            LVar11 = lydict_insert(plVar28,"lyds_tree",0,(char **)(plVar16 + lVar26 * 0x16 + -0x15))
            ;
            if (LVar11 == LY_SUCCESS) {
              if (pctx == (lysp_yang_ctx *)0x0) {
                plVar28 = (ly_ctx *)0x0;
              }
              else {
                plVar28 = (ly_ctx *)
                          **(undefined8 **)
                            (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
              }
              LVar11 = lydict_insert(plVar28,"uint64",0,(char **)(plVar16 + lVar26 * 0x16 + -0xd));
              if (LVar11 != LY_SUCCESS) goto LAB_001562e8;
              plVar16[lVar26 * 0x16 + -3] = (long)plVar4;
              plVar29 = plVar4->exts;
              if (plVar29 != (lysp_ext_instance *)0x0) {
                plVar31 = plVar29[-1].exts;
                plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar31->name + 1);
                plVar16 = (long *)realloc(&plVar29[-1].exts,(long)plVar31 * 0x70 + 0x78);
                if (plVar16 != (long *)0x0) {
                  lVar26 = *plVar16;
                  goto LAB_001561ad;
                }
                pplVar1 = &plVar4->exts[-1].exts;
                *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
LAB_00156246:
                if (pctx == (lysp_yang_ctx *)0x0) {
                  plVar28 = (ly_ctx *)0x0;
                }
                else {
                  plVar28 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
LAB_001562c4:
                LVar11 = LY_EMEM;
                ly_log(plVar28,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lysp_add_internal_yang");
                goto LAB_001562e8;
              }
              plVar16 = (long *)malloc(0x78);
              if (plVar16 == (long *)0x0) goto LAB_00156246;
              *plVar16 = 1;
              lVar26 = 1;
LAB_001561ad:
              plVar4->exts = (lysp_ext_instance *)(plVar16 + 1);
              plVar3 = plVar16 + lVar26 * 0xe;
              plVar3[-1] = 0;
              *plVar3 = 0;
              plVar3[-3] = 0;
              plVar3[-2] = 0;
              plVar3[-5] = 0;
              plVar3[-4] = 0;
              plVar3[-7] = 0;
              plVar3[-6] = 0;
              plVar3[-9] = 0;
              plVar3[-8] = 0;
              plVar3[-0xb] = 0;
              plVar3[-10] = 0;
              plVar3[-0xd] = 0;
              plVar3[-0xc] = 0;
              LVar11 = lydict_insert(plVar4->mod->ctx,"md:annotation",0,(char **)(plVar3 + -0xd));
              if ((LVar11 != LY_SUCCESS) ||
                 (LVar11 = lydict_insert(plVar4->mod->ctx,"lyds_tree",0,
                                         (char **)(plVar16 + lVar26 * 0xe + -0xc)),
                 LVar11 != LY_SUCCESS)) goto LAB_001562e8;
              *(undefined4 *)(plVar16 + lVar26 * 0xe + -0xb) = 1;
              plVar16[lVar26 * 0xe + -10] = (long)plVar4;
              plVar16[lVar26 * 0xe + -8] = (long)plVar4;
              *(undefined4 *)(plVar16 + lVar26 * 0xe + -7) = 0x1c0000;
              *(undefined2 *)(plVar16 + lVar26 * 0xe + -5) = 0x1000;
              ppcVar21 = (char **)calloc(1,0x38);
              plVar16[lVar26 * 0xe + -1] = (long)ppcVar21;
              plVar28 = plVar4->mod->ctx;
              if (ppcVar21 == (char **)0x0) goto LAB_001562c4;
              LVar11 = lydict_insert(plVar28,"type",0,ppcVar21);
              if ((LVar11 != LY_SUCCESS) ||
                 (LVar11 = lydict_insert(plVar4->mod->ctx,"lyds_tree",0,ppcVar21 + 1),
                 LVar11 != LY_SUCCESS)) goto LAB_001562e8;
              *(undefined4 *)(ppcVar21 + 2) = 1;
              ppcVar21[3] = (char *)plVar4;
              *(undefined4 *)((long)ppcVar21 + 0x34) = 0x2e0000;
              if (plVar25 == (lysp_ext_instance *)0x0) {
                if ((lysp_yang_ctx *)pctx->main_ctx != pctx) {
                  __assert_fail("pctx->main_ctx == pctx",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                                ,0x707,
                                "LY_ERR lysp_add_internal_yang(struct lysp_ctx *, struct lysp_module *)"
                               );
                }
                LVar11 = ly_set_add(&pctx->ext_inst,plVar4->exts,'\x01',(uint32_t *)0x0);
                if (LVar11 == LY_SUCCESS) goto LAB_00155791;
                goto LAB_001562e8;
              }
              lVar10 = ly_set_contains(&pctx->ext_inst,plVar25,(uint32_t *)&local_78);
              if (lVar10 == '\0') {
                LVar11 = LY_EINT;
                ly_log(plVar4->mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                       ,0x70c);
                goto LAB_001562e8;
              }
              (pctx->ext_inst).field_2.dnodes[(ulong)local_78.ctx & 0xffffffff] =
                   (lyd_node *)plVar4->exts;
LAB_00155791:
              LVar11 = ly_set_add(new_mods,mod,'\x01',(uint32_t *)0x0);
              if (LVar11 == LY_SUCCESS) {
                bVar8 = false;
                LVar11 = ly_set_add(&ctx->list,mod,'\x01',(uint32_t *)0x0);
                if (LVar11 == LY_SUCCESS) {
                  ctx->change_count = ctx->change_count + 1;
                  LVar11 = lysp_resolve_import_include((lysp_ctx *)pctx,mod->parsed,new_mods);
                  if (LVar11 == LY_SUCCESS) {
                    local_78.mod = (lys_module *)0x0;
                    local_78.ext_set.size = 0;
                    local_78.ext_set.count = 0;
                    local_78.ext_set.field_2.dnodes = (lyd_node **)0x0;
                    if (pctx == (lysp_yang_ctx *)0x0) {
                      local_78.ctx = (ly_ctx *)0x0;
                    }
                    else {
                      local_78.ctx = (ly_ctx *)
                                     **(ulong **)
                                       (pctx->parsed_mods->field_2).dnodes
                                       [pctx->parsed_mods->count - 1];
                    }
                    for (uVar34 = 0; uVar18 = (ulong)(pctx->ext_inst).count, uVar34 < uVar18;
                        uVar34 = uVar34 + 1) {
                      plVar25 = (lysp_ext_instance *)(pctx->ext_inst).field_2.dnodes[uVar34];
                      plVar31 = (lysp_ext_instance *)0x0;
                      plVar29 = plVar25;
                      while( true ) {
                        if (plVar25 == (lysp_ext_instance *)0x0) {
                          plVar19 = (lysp_ext_instance *)0x0;
                        }
                        else {
                          plVar19 = plVar25[-1].exts;
                        }
                        if (plVar19 <= plVar31) break;
                        if (pctx == (lysp_yang_ctx *)0x0) {
                          plVar28 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar28 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        LVar11 = lysp_ext_find_definition(plVar28,plVar29,&local_58,&plVar29->def);
                        if (LVar11 != LY_SUCCESS) goto LAB_00156914;
                        if (pctx == (lysp_yang_ctx *)0x0) {
                          plVar28 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar28 = (ly_ctx *)
                                    **(undefined8 **)
                                      (pctx->parsed_mods->field_2).dnodes
                                      [pctx->parsed_mods->count - 1];
                        }
                        LVar11 = lysp_ext_instance_resolve_argument(plVar28,plVar29);
                        if (LVar11 != LY_SUCCESS) goto LAB_00156914;
                        plVar20 = lyplg_ext_record_find
                                            (local_58->ctx,local_58->name,local_58->revision,
                                             plVar29->def->name);
                        plVar29->record = plVar20;
                        plVar31 = (lysp_ext_instance *)((long)&plVar31->name + 1);
                        plVar29 = plVar29 + 1;
                      }
                    }
                    local_90 = 0;
LAB_00156456:
                    if (local_90 < uVar18) {
                      plVar7 = (pctx->ext_inst).field_2.dnodes[local_90];
                      local_c0 = (void *)0x0;
                      do {
                        plVar25 = (lysp_ext_instance *)(plVar7 + (long)local_c0 * 2);
LAB_00156496:
                        if (plVar7 == (lyd_node *)0x0) {
                          pvVar24 = (void *)0x0;
                        }
                        else {
                          pvVar24 = plVar7[-1].priv;
                        }
                        if (pvVar24 <= local_c0) {
                          local_90 = local_90 + 1;
                          uVar18 = (ulong)(pctx->ext_inst).count;
                          goto LAB_00156456;
                        }
                        if ((plVar25->record == (lyplg_ext_record *)0x0) ||
                           ((plVar25->record->plugin).parse == (lyplg_ext_parse_clb)0x0))
                        goto LAB_00156769;
                        if ((short)plVar25->parent_stmt != LY_STMT_NONE) {
                          plVar16 = (long *)plVar25->parent;
                          plVar27 = (pctx->parsed_mods->field_2).dnodes
                                    [pctx->parsed_mods->count - 1];
                          local_98 = (char *)0x0;
                          iVar12 = 0;
                          while ((pcVar23 = local_98, plVar16 != (long *)0x0 && (-1 < iVar12))) {
                            if (*plVar16 == 0) {
                              pcVar30 = local_98;
                              if (local_98 == (char *)0x0) {
                                pcVar30 = "";
                              }
                              iVar12 = asprintf(&local_98,"%s%s:%s%s","/",
                                                *(undefined8 *)(*(long *)plVar27 + 8),plVar16[3],
                                                pcVar30);
                            }
                            else {
                              pcVar30 = local_98;
                              if (local_98 == (char *)0x0) {
                                pcVar30 = "";
                              }
                              iVar12 = asprintf(&local_98,"%s%s%s","/",plVar16[3],pcVar30);
                            }
                            free(pcVar23);
                            plVar16 = (long *)*plVar16;
                          }
                          if (iVar12 < 0) {
                            free(local_98);
                          }
                          else {
                            if (iVar12 == 0) {
                              pcVar23 = strdup("/");
                            }
                            if (pcVar23 != (char *)0x0) {
                              sVar22 = strlen(pcVar23);
                              iVar12 = (int)sVar22;
                              pcVar23 = (char *)realloc(pcVar23,(ulong)(iVar12 + 2));
                              if (pcVar23 != (char *)0x0) {
                                iVar33 = iVar12 + 1;
                                (pcVar23 + (sVar22 & 0xffffffff))[0] = '/';
                                (pcVar23 + (sVar22 & 0xffffffff))[1] = '\0';
                                uVar13 = iVar12 + 1;
                                goto LAB_00156645;
                              }
                            }
                          }
LAB_001568ba:
                          if (pctx == (lysp_yang_ctx *)0x0) {
                            plVar28 = (ly_ctx *)0x0;
                          }
                          else {
                            puVar32 = *(undefined8 **)
                                       (pctx->parsed_mods->field_2).dnodes
                                       [pctx->parsed_mods->count - 1];
LAB_001568db:
                            plVar28 = (ly_ctx *)*puVar32;
                          }
                          LVar11 = LY_EMEM;
                          ly_log(plVar28,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                 "lysp_resolve_ext_instance_log_path");
                          goto LAB_00156914;
                        }
                        puVar32 = *(undefined8 **)
                                   (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1]
                        ;
                        pcVar30 = (char *)puVar32[1];
                        sVar22 = strlen(pcVar30);
                        pcVar23 = (char *)malloc((ulong)((int)sVar22 + 3));
                        if (pcVar23 == (char *)0x0) goto LAB_001568db;
                        iVar33 = (int)sVar22 + 2;
                        uVar13 = sprintf(pcVar23,"/%s:",pcVar30);
LAB_00156645:
                        pcVar30 = plVar25->name;
                        sVar22 = strlen(pcVar30);
                        iVar33 = iVar33 + (int)sVar22;
                        pcVar23 = (char *)realloc(pcVar23,(ulong)(iVar33 + 0xf));
                        if (pcVar23 == (char *)0x0) goto LAB_001568ba;
                        iVar12 = sprintf(pcVar23 + uVar13,"{extension=\'%s\'}",pcVar30);
                        pcVar30 = plVar25->argument;
                        if (pcVar30 != (char *)0x0) {
                          sVar22 = strlen(pcVar30);
                          pcVar23 = (char *)realloc(pcVar23,(ulong)((int)sVar22 + iVar33 + 0x10));
                          if (pcVar23 == (char *)0x0) goto LAB_001568ba;
                          sprintf(pcVar23 + (iVar12 + uVar13),"/%s",pcVar30);
                        }
                        ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,pcVar23,(ly_in *)0x0);
                        LVar11 = (*(plVar25->record->plugin).parse)((lysp_ctx *)pctx,plVar25);
                        ly_log_location_revert(0,0,1,0);
                        free(pcVar23);
                        if (LVar11 == LY_ENOT) {
                          lysp_ext_instance_free(&local_78,plVar25);
                          pvVar24 = (void *)((long)plVar7[-1].priv + -1);
                          plVar7[-1].priv = pvVar24;
                          if (local_c0 < pvVar24) {
                            plVar27 = plVar7 + (long)pvVar24 * 2;
                            plVar29 = plVar25;
                            for (lVar26 = 0xe; lVar26 != 0; lVar26 = lVar26 + -1) {
                              plVar29->name = *(char **)plVar27;
                              plVar27 = (lyd_node *)((long)plVar27 + (ulong)bVar36 * -0x10 + 8);
                              plVar29 = (lysp_ext_instance *)
                                        ((long)plVar29 + (ulong)bVar36 * -0x10 + 8);
                            }
                          }
                          goto LAB_00156496;
                        }
                        if (LVar11 != LY_SUCCESS) goto LAB_00156914;
LAB_00156769:
                        local_c0 = (void *)((long)local_c0 + 1);
                      } while( true );
                    }
                    LVar11 = lysp_check_dup_typedefs((lysp_ctx *)pctx,mod->parsed);
                    if ((((LVar11 == LY_SUCCESS) &&
                         (LVar11 = lysp_check_dup_groupings((lysp_ctx *)pctx,mod->parsed),
                         LVar11 == LY_SUCCESS)) &&
                        (LVar11 = lysp_check_dup_features((lysp_ctx *)pctx,mod->parsed),
                        LVar11 == LY_SUCCESS)) &&
                       ((LVar11 = lysp_check_dup_identities((lysp_ctx *)pctx,mod->parsed),
                        LVar11 == LY_SUCCESS &&
                        (LVar11 = lys_compile_feature_iffeatures(mod->parsed), LVar11 == LY_SUCCESS)
                        ))) {
                      LVar11 = lys_compile_identities(mod);
                    }
                    bVar8 = false;
                  }
                  else {
LAB_00156914:
                    bVar8 = false;
                  }
                }
                goto LAB_001554bc;
              }
            }
LAB_001562e8:
            bVar8 = true;
            goto LAB_001554bc;
          }
          plVar4 = mod->parsed;
          plVar25 = plVar4->exts;
          if (plVar25 != (lysp_ext_instance *)0x0) {
            plVar29 = plVar25[-1].exts;
            plVar25[-1].exts = (lysp_ext_instance *)((long)&plVar29->name + 1);
            plVar16 = (long *)realloc(&plVar25[-1].exts,(long)plVar29 * 0x70 + 0x78);
            if (plVar16 != (long *)0x0) {
              lVar26 = *plVar16;
              goto LAB_0015599c;
            }
            pplVar1 = &plVar4->exts[-1].exts;
            *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
LAB_00155d3f:
            LVar11 = LY_EMEM;
            ly_log(plVar4->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lysp_add_internal_ietf_netconf");
            goto LAB_00156d42;
          }
          plVar16 = (long *)malloc(0x78);
          if (plVar16 == (long *)0x0) goto LAB_00155d3f;
          *plVar16 = 1;
          lVar26 = 1;
LAB_0015599c:
          plVar4->exts = (lysp_ext_instance *)(plVar16 + 1);
          plVar16 = plVar16 + lVar26 * 0xe;
          plVar16[-1] = 0;
          *plVar16 = 0;
          plVar16[-3] = 0;
          plVar16[-2] = 0;
          plVar16[-5] = 0;
          plVar16[-4] = 0;
          plVar16[-7] = 0;
          plVar16[-6] = 0;
          plVar16[-9] = 0;
          plVar16[-8] = 0;
          plVar16[-0xb] = 0;
          plVar16[-10] = 0;
          ppcVar21 = (char **)(plVar16 + -0xd);
          *ppcVar21 = (char *)0x0;
          plVar16[-0xc] = 0;
          plVar28 = plVar4->mod->ctx;
          if (ppcVar21 == (char **)0x0) {
LAB_00156d1e:
            LVar11 = LY_EMEM;
            ly_log(plVar28,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lysp_add_internal_ietf_netconf");
          }
          else {
            LVar11 = lydict_insert(plVar28,"md_:annotation",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"operation",0,(char **)(plVar16 + -0xc)),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(plVar16 + -0xb) = 1;
            plVar16[-10] = (long)plVar4;
            plVar16[-8] = (long)plVar4;
            *(undefined4 *)(plVar16 + -7) = 0x1c0000;
            *(undefined2 *)(plVar16 + -5) = 0x1000;
            ppcVar21 = (char **)calloc(1,0x38);
            plVar16[-1] = (long)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"type",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"enumeration",0,ppcVar21 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar21 + 2) = 1;
            ppcVar21[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar21 + 0x34) = 0x2e0000;
            ppcVar17 = (char **)calloc(1,0x38);
            ppcVar21[5] = (char *)ppcVar17;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar17 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar17);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"merge",0,ppcVar17 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar17 + 2) = 1;
            ppcVar17[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar17 + 0x34) = 0xb0000;
            ppcVar21 = (char **)calloc(1,0x38);
            ppcVar17[4] = (char *)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"replace",0,ppcVar21 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar21 + 2) = 1;
            ppcVar21[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar21 + 0x34) = 0xb0000;
            ppcVar17 = (char **)calloc(1,0x38);
            ppcVar21[4] = (char *)ppcVar17;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar17 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar17);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"create",0,ppcVar17 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar17 + 2) = 1;
            ppcVar17[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar17 + 0x34) = 0xb0000;
            ppcVar21 = (char **)calloc(1,0x38);
            ppcVar17[4] = (char *)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"delete",0,ppcVar21 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar21 + 2) = 1;
            ppcVar21[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar21 + 0x34) = 0xb0000;
            local_c0 = (void *)0x1;
            ppcVar17 = (char **)calloc(1,0x38);
            ppcVar21[4] = (char *)ppcVar17;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar17 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar17);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"remove",0,ppcVar17 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar17 + 2) = 1;
            ppcVar17[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar17 + 0x34) = 0xb0000;
            plVar29 = plVar4->exts;
            if (plVar29 == (lysp_ext_instance *)0x0) {
              plVar16 = (long *)malloc(0x78);
              if (plVar16 != (long *)0x0) {
                *plVar16 = 1;
                goto LAB_00156a57;
              }
LAB_00156d17:
              plVar28 = plVar4->mod->ctx;
              goto LAB_00156d1e;
            }
            plVar31 = plVar29[-1].exts;
            plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar31->name + 1);
            plVar16 = (long *)realloc(&plVar29[-1].exts,(long)plVar31 * 0x70 + 0x78);
            if (plVar16 == (long *)0x0) {
LAB_00156d0e:
              plVar25 = plVar4->exts;
LAB_00156d13:
              plVar25[-1].exts = (lysp_ext_instance *)((long)&plVar25[-1].exts[-1].exts + 7);
              goto LAB_00156d17;
            }
            local_c0 = (void *)*plVar16;
LAB_00156a57:
            plVar4->exts = (lysp_ext_instance *)(plVar16 + 1);
            plVar16 = plVar16 + (long)local_c0 * 0xe;
            plVar16[-1] = 0;
            *plVar16 = 0;
            plVar16[-3] = 0;
            plVar16[-2] = 0;
            plVar16[-5] = 0;
            plVar16[-4] = 0;
            plVar16[-7] = 0;
            plVar16[-6] = 0;
            plVar16[-9] = 0;
            plVar16[-8] = 0;
            plVar16[-0xb] = 0;
            plVar16[-10] = 0;
            ppcVar21 = (char **)(plVar16 + -0xd);
            *ppcVar21 = (char *)0x0;
            plVar16[-0xc] = 0;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"md_:annotation",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"type",0,(char **)(plVar16 + -0xc)),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(plVar16 + -0xb) = 1;
            plVar16[-10] = (long)plVar4;
            plVar16[-8] = (long)plVar4;
            *(undefined4 *)(plVar16 + -7) = 0x1c0000;
            *(undefined2 *)(plVar16 + -5) = 0x1000;
            ppcVar21 = (char **)calloc(1,0x38);
            plVar16[-1] = (long)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"type",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"enumeration",0,ppcVar21 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar21 + 2) = 1;
            ppcVar21[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar21 + 0x34) = 0x2e0000;
            ppcVar17 = (char **)calloc(1,0x38);
            ppcVar21[5] = (char *)ppcVar17;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar17 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar17);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"subtree",0,ppcVar17 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar17 + 2) = 1;
            ppcVar17[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar17 + 0x34) = 0xb0000;
            local_c0 = (void *)0x1;
            ppcVar21 = (char **)calloc(1,0x38);
            ppcVar17[4] = (char *)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"enum",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"xpath",0,ppcVar21 + 1),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(ppcVar21 + 2) = 1;
            ppcVar21[3] = (char *)plVar4;
            *(undefined4 *)((long)ppcVar21 + 0x34) = 0xb0000;
            if (1 < plVar4->version) {
              ppcVar17 = (char **)calloc(1,0x38);
              ppcVar21[5] = (char *)ppcVar17;
              plVar28 = plVar4->mod->ctx;
              if (ppcVar17 == (char **)0x0) goto LAB_00156d1e;
              LVar11 = lydict_insert(plVar28,"if-feature",0,ppcVar17);
              if ((LVar11 != LY_SUCCESS) ||
                 (LVar11 = lydict_insert(plVar4->mod->ctx,"xpath",0,ppcVar17 + 1),
                 LVar11 != LY_SUCCESS)) goto LAB_00156d42;
              *(undefined4 *)(ppcVar17 + 2) = 1;
              ppcVar17[3] = (char *)plVar4;
              *(undefined4 *)((long)ppcVar17 + 0x34) = 0x130000;
            }
            plVar29 = plVar4->exts;
            if (plVar29 == (lysp_ext_instance *)0x0) {
              plVar16 = (long *)malloc(0x78);
              if (plVar16 == (long *)0x0) goto LAB_00156d17;
              *plVar16 = 1;
            }
            else {
              plVar31 = plVar29[-1].exts;
              plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar31->name + 1);
              plVar16 = (long *)realloc(&plVar29[-1].exts,(long)plVar31 * 0x70 + 0x78);
              if (plVar16 == (long *)0x0) goto LAB_00156d0e;
              local_c0 = (void *)*plVar16;
            }
            plVar4->exts = (lysp_ext_instance *)(plVar16 + 1);
            plVar16 = plVar16 + (long)local_c0 * 0xe;
            plVar16[-1] = 0;
            *plVar16 = 0;
            plVar16[-3] = 0;
            plVar16[-2] = 0;
            plVar16[-5] = 0;
            plVar16[-4] = 0;
            plVar16[-7] = 0;
            plVar16[-6] = 0;
            plVar16[-9] = 0;
            plVar16[-8] = 0;
            plVar16[-0xb] = 0;
            plVar16[-10] = 0;
            ppcVar21 = (char **)(plVar16 + -0xd);
            *ppcVar21 = (char *)0x0;
            plVar16[-0xc] = 0;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"md_:annotation",0,ppcVar21);
            if ((LVar11 != LY_SUCCESS) ||
               (LVar11 = lydict_insert(plVar4->mod->ctx,"select",0,(char **)(plVar16 + -0xc)),
               LVar11 != LY_SUCCESS)) goto LAB_00156d42;
            *(undefined4 *)(plVar16 + -0xb) = 1;
            plVar16[-10] = (long)plVar4;
            plVar16[-8] = (long)plVar4;
            *(undefined4 *)(plVar16 + -7) = 0x1c0000;
            *(undefined2 *)(plVar16 + -5) = 0x1000;
            local_c0 = (void *)0x1;
            ppcVar21 = (char **)calloc(1,0x38);
            plVar16[-1] = (long)ppcVar21;
            plVar28 = plVar4->mod->ctx;
            if (ppcVar21 == (char **)0x0) goto LAB_00156d1e;
            LVar11 = lydict_insert(plVar28,"type",0,ppcVar21);
            if ((LVar11 == LY_SUCCESS) &&
               (LVar11 = lydict_insert(plVar4->mod->ctx,"yang_:xpath1.0",0,ppcVar21 + 1),
               LVar11 == LY_SUCCESS)) {
              *(undefined4 *)(ppcVar21 + 2) = 1;
              ppcVar21[3] = (char *)plVar4;
              *(undefined4 *)((long)ppcVar21 + 0x34) = 0x2e0000;
              if (plVar25 == (lysp_ext_instance *)0x0) {
                if ((lysp_yang_ctx *)pctx->main_ctx != pctx) {
                  __assert_fail("pctx->main_ctx == pctx",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                                ,0x686,
                                "LY_ERR lysp_add_internal_ietf_netconf(struct lysp_ctx *, struct lysp_module *)"
                               );
                }
                LVar11 = ly_set_add(&pctx->ext_inst,plVar4->exts,'\x01',(uint32_t *)0x0);
                if (LVar11 == LY_SUCCESS) goto LAB_00156f29;
              }
              else {
                lVar10 = ly_set_contains(&pctx->ext_inst,plVar25,(uint32_t *)&local_78);
                if (lVar10 == '\0') {
                  LVar11 = LY_EINT;
                  ly_log(plVar4->mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                         ,0x68b);
                }
                else {
                  (pctx->ext_inst).field_2.dnodes[(ulong)local_78.ctx & 0xffffffff] =
                       (lyd_node *)plVar4->exts;
LAB_00156f29:
                  plVar6 = plVar4->imports;
                  if (plVar6 != (lysp_import *)0x0) {
                    lVar26 = *(long *)(plVar6[-1].rev + 6) + 1;
                    *(long *)(plVar6[-1].rev + 6) = lVar26;
                    plVar16 = (long *)realloc(plVar6[-1].rev + 6,lVar26 * 0x40 | 8);
                    if (plVar16 != (long *)0x0) {
                      lVar26 = *plVar16;
                      goto LAB_00156fcb;
                    }
LAB_00157121:
                    plVar25 = (lysp_ext_instance *)plVar4->imports;
                    goto LAB_00156d13;
                  }
                  plVar16 = (long *)malloc(0x48);
                  if (plVar16 == (long *)0x0) goto LAB_00156d17;
                  *plVar16 = 1;
                  lVar26 = 1;
LAB_00156fcb:
                  plVar4->imports = (lysp_import *)(plVar16 + 1);
                  plVar3 = plVar16 + lVar26 * 8;
                  plVar3[-1] = 0;
                  *plVar3 = 0;
                  plVar3[-3] = 0;
                  plVar3[-2] = 0;
                  plVar3[-5] = 0;
                  plVar3[-4] = 0;
                  plVar3[-7] = 0;
                  plVar3[-6] = 0;
                  LVar11 = lydict_insert(plVar4->mod->ctx,"ietf-yang-metadata",0,
                                         (char **)(plVar3 + -6));
                  if ((LVar11 == LY_SUCCESS) &&
                     (LVar11 = lydict_insert(plVar4->mod->ctx,"md_",0,
                                             (char **)(plVar16 + lVar26 * 8 + -5)),
                     LVar11 == LY_SUCCESS)) {
                    *(undefined2 *)(plVar16 + lVar26 * 8 + -1) = 0x1000;
                    plVar6 = plVar4->imports;
                    if (plVar6 == (lysp_import *)0x0) {
                      plVar16 = (long *)malloc(0x48);
                      if (plVar16 == (long *)0x0) goto LAB_00156d17;
                      *plVar16 = 1;
                    }
                    else {
                      lVar26 = *(long *)(plVar6[-1].rev + 6) + 1;
                      *(long *)(plVar6[-1].rev + 6) = lVar26;
                      plVar16 = (long *)realloc(plVar6[-1].rev + 6,lVar26 * 0x40 | 8);
                      if (plVar16 == (long *)0x0) goto LAB_00157121;
                      local_c0 = (void *)*plVar16;
                    }
                    plVar4->imports = (lysp_import *)(plVar16 + 1);
                    plVar3 = plVar16 + (long)local_c0 * 8;
                    plVar3[-1] = 0;
                    *plVar3 = 0;
                    plVar3[-3] = 0;
                    plVar3[-2] = 0;
                    plVar3[-5] = 0;
                    plVar3[-4] = 0;
                    plVar3[-7] = 0;
                    plVar3[-6] = 0;
                    LVar11 = lydict_insert(plVar4->mod->ctx,"ietf-yang-types",0,
                                           (char **)(plVar3 + -6));
                    if ((LVar11 == LY_SUCCESS) &&
                       (LVar11 = lydict_insert(plVar4->mod->ctx,"yang_",0,
                                               (char **)(plVar16 + (long)local_c0 * 8 + -5)),
                       LVar11 == LY_SUCCESS)) {
                      *(undefined2 *)(plVar16 + (long)local_c0 * 8 + -1) = 0x1000;
                      goto LAB_00155791;
                    }
                  }
                }
              }
            }
          }
LAB_00156d42:
          bVar8 = true;
          goto LAB_001554bc;
        }
        LVar11 = LY_EINT;
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
               ,0x777);
      }
      else {
        LVar11 = LY_EINVAL;
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
               local_a0->name,mod->name,mod->ns);
      }
      bVar8 = true;
      goto LAB_001554f3;
    }
    pcVar23 = "<none>";
    if (local_a0->revision != (char *)0x0) {
      pcVar23 = local_a0->revision;
    }
    LVar11 = LY_SUCCESS;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s@%s\" is already present in the context.",
           local_a0->name,pcVar23);
  }
  else {
    if (format == LYS_IN_YIN) {
      context = (lysp_yang_ctx **)&yinctx;
      LVar11 = yin_parse_module((lysp_yin_ctx **)context,in,mod);
      goto LAB_0015549b;
    }
    local_a0 = (lys_module *)0x0;
    LVar11 = LY_EINVAL;
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid schema input format.");
    bVar8 = true;
LAB_001554f3:
    if (((mod->name != (char *)0x0) && (plVar14 = ly_err_last(ctx), plVar14 != (ly_err_item *)0x0))
       && ((plVar14->schema_path == (char *)0x0 || (plVar14->line != 0)))) {
      ly_log(ctx,LY_LLERR,LY_EOTHER,"Parsing module \"%s\" failed.",mod->name);
    }
LAB_001555db:
    if (!bVar8) goto LAB_00155605;
  }
  local_50.mod = mod;
  lys_module_free(&local_50,mod,'\0');
  lysf_ctx_erase(&local_50);
  mod = local_a0;
LAB_00155605:
  if (format == LYS_IN_YANG) {
    lysp_yang_ctx_free(yangctx);
  }
  else {
    lysp_yin_ctx_free(yinctx);
  }
  if ((module != (lys_module **)0x0) && (LVar11 == LY_SUCCESS)) {
    *module = mod;
    LVar11 = LY_SUCCESS;
  }
  return LVar11;
}

Assistant:

LY_ERR
lys_parse_in(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format,
        LY_ERR (*custom_check)(const struct ly_ctx *ctx, struct lysp_module *mod, struct lysp_submodule *submod, void *data),
        void *check_data, struct ly_set *new_mods, struct lys_module **module)
{
    struct lys_module *mod = NULL, *latest, *mod_dup = NULL;
    LY_ERR ret;
    struct lysp_yang_ctx *yangctx = NULL;
    struct lysp_yin_ctx *yinctx = NULL;
    struct lysp_ctx *pctx = NULL;
    struct lysf_ctx fctx = {.ctx = ctx};
    ly_bool module_created = 0;

    assert(ctx && in && new_mods);

    if (module) {
        *module = NULL;
    }

    mod = calloc(1, sizeof *mod);
    LY_CHECK_ERR_RET(!mod, LOGMEM(ctx), LY_EMEM);
    mod->ctx = ctx;

    /* parse */
    switch (format) {
    case LYS_IN_YIN:
        ret = yin_parse_module(&yinctx, in, mod);
        pctx = (struct lysp_ctx *)yinctx;
        break;
    case LYS_IN_YANG:
        ret = yang_parse_module(&yangctx, in, mod);
        pctx = (struct lysp_ctx *)yangctx;
        break;
    default:
        LOGERR(ctx, LY_EINVAL, "Invalid schema input format.");
        ret = LY_EINVAL;
        break;
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* make sure that the newest revision is at position 0 */
    lysp_sort_revisions(mod->parsed->revs);
    if (mod->parsed->revs) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, mod->parsed->revs[0].date, 0, &mod->revision), cleanup);
    }

    /* decide the latest revision */
    latest = ly_ctx_get_module_latest(ctx, mod->name);
    if (latest) {
        if (mod->revision) {
            if (!latest->revision) {
                /* latest has no revision, so mod is anyway newer */
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else if (strcmp(mod->revision, latest->revision) > 0) {
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else {
                latest = NULL;
            }
        } else {
            latest = NULL;
        }
    } else {
        mod->latest_revision = LYS_MOD_LATEST_REV;
    }

    if (custom_check) {
        LY_CHECK_GOTO(ret = custom_check(ctx, mod->parsed, NULL, check_data), cleanup);
    }

    /* check whether it is not already in the context in the same revision */
    mod_dup = ly_ctx_get_module(ctx, mod->name, mod->revision);
    if (mod_dup) {
        /* nothing to do */
        LOGVRB("Module \"%s@%s\" is already present in the context.", mod_dup->name,
                mod_dup->revision ? mod_dup->revision : "<none>");
        goto cleanup;
    }

    /* check whether there is not a namespace collision */
    mod_dup = ly_ctx_get_module_latest_ns(ctx, mod->ns);
    if (mod_dup && (mod_dup->revision == mod->revision)) {
        LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                mod_dup->name, mod->name, mod->ns);
        ret = LY_EINVAL;
        goto cleanup;
    }

    switch (in->type) {
    case LY_IN_FILEPATH:
        ly_check_module_filename(ctx, mod->name, mod->parsed->revs ? mod->parsed->revs[0].date : NULL, in->method.fpath.filepath);
        break;
    case LY_IN_FD:
    case LY_IN_FILE:
    case LY_IN_MEMORY:
        /* nothing special to do */
        break;
    case LY_IN_ERROR:
        LOGINT(ctx);
        ret = LY_EINT;
        goto cleanup;
    }
    lys_parser_fill_filepath(ctx, in, &mod->filepath);

    if (latest) {
        latest->latest_revision &= ~(LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
    }

    /* add internal data in case specific modules were parsed */
    if (!strcmp(mod->name, "ietf-netconf")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "ietf-netconf-with-defaults")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf_with_defaults(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "yang")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_yang(pctx, mod->parsed), cleanup);
    }

    /* add the module into newly created module set, will also be freed from there on any error */
    LY_CHECK_GOTO(ret = ly_set_add(new_mods, mod, 1, NULL), cleanup);
    module_created = 1;

    /* add into context */
    ret = ly_set_add(&ctx->list, mod, 1, NULL);
    LY_CHECK_GOTO(ret, cleanup);
    ctx->change_count++;

    /* resolve includes and all imports */
    LY_CHECK_GOTO(ret = lysp_resolve_import_include(pctx, mod->parsed, new_mods), cleanup);

    /* resolve extension instance plugin records */
    LY_CHECK_GOTO(ret = lysp_resolve_ext_instance_records(pctx), cleanup);

    /* check name collisions */
    LY_CHECK_GOTO(ret = lysp_check_dup_typedefs(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_groupings(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_features(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_identities(pctx, mod->parsed), cleanup);

    /* compile features */
    LY_CHECK_GOTO(ret = lys_compile_feature_iffeatures(mod->parsed), cleanup);

    /* compile identities */
    LY_CHECK_GOTO(ret = lys_compile_identities(mod), cleanup);

cleanup:
    if (ret && (ret != LY_EEXIST)) {
        if (mod && mod->name) {
            /* there are cases when path is not available for parsing error, so this additional
             * message tries to add information about the module where the error occurred */
            const struct ly_err_item *e = ly_err_last(ctx);

            if (e && (!e->schema_path || e->line)) {
                LOGERR(ctx, LY_EOTHER, "Parsing module \"%s\" failed.", mod->name);
            }
        }
    }
    if (!module_created) {
        fctx.mod = mod;
        lys_module_free(&fctx, mod, 0);
        lysf_ctx_erase(&fctx);

        mod = mod_dup;
    }

    if (format == LYS_IN_YANG) {
        lysp_yang_ctx_free(yangctx);
    } else {
        lysp_yin_ctx_free(yinctx);
    }

    if (!ret && module) {
        *module = mod;
    }
    return ret;
}